

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O0

iter * __thiscall riffcpp::Chunk::iterator::operator++(iterator *this)

{
  __mbstate_t _Var1;
  fpos<__mbstate_t> fVar2;
  uint32_t uVar3;
  impl *this_00;
  streamoff sVar4;
  streamoff sVar5;
  Error *this_01;
  streamoff offs;
  uint32_t sz;
  Chunk chunk;
  fpos<__mbstate_t> limit;
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> local_58;
  streamoff local_48;
  __mbstate_t _Stack_40;
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> local_38;
  _Type local_28;
  impl *local_18;
  impl *im;
  iterator *this_local;
  
  im = (impl *)this;
  this_00 = (impl *)operator_new(0x48);
  (this_00->m_limit)._M_off = 0;
  (this_00->m_limit)._M_state.__count = 0;
  (this_00->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_pos)._M_off = 0;
  (this_00->m_pos)._M_state.__count = 0;
  (this_00->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this_00->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00->m_id = (_Type)0x0;
  this_00->m_size = 0;
  Chunk::impl::impl(this_00);
  local_18 = this_00;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::operator=
            ((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,
             &this->pimpl->m_stream);
  _Var1 = (this->pimpl->m_pos)._M_state;
  (local_18->m_pos)._M_off = (this->pimpl->m_pos)._M_off;
  (local_18->m_pos)._M_state = _Var1;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::shared_ptr
            (&local_38,&local_18->m_stream);
  local_48 = (local_18->m_pos)._M_off;
  _Stack_40 = (local_18->m_pos)._M_state;
  local_28 = (_Type)read_id(&local_38,local_18->m_pos);
  *&(local_18->m_id)._M_elems = local_28;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::~shared_ptr(&local_38);
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::shared_ptr
            (&local_58,&local_18->m_stream);
  uVar3 = read_size(&local_58,local_18->m_pos);
  local_18->m_size = uVar3;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::~shared_ptr(&local_58);
  _chunk = std::fpos<__mbstate_t>::operator+(&local_18->m_pos,(ulong)local_18->m_size);
  sVar4 = std::fpos::operator_cast_to_long((fpos *)&chunk);
  sVar5 = std::fpos::operator_cast_to_long((fpos *)&this->pimpl->m_limit);
  fVar2 = _chunk;
  if (sVar5 < sVar4) {
    this_01 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(this_01,"Chunk size outside of range",InvalidFile);
    __cxa_throw(this_01,&Error::typeinfo,0);
  }
  (local_18->m_limit)._M_off = (streamoff)chunk.pimpl;
  (local_18->m_limit)._M_state.__count = (undefined4)limit._M_off;
  (local_18->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)limit._M_off._4_4_;
  _chunk = fVar2;
  Chunk((Chunk *)&stack0xffffffffffffff80,local_18);
  uVar3 = size((Chunk *)&stack0xffffffffffffff80);
  std::fpos<__mbstate_t>::operator+=(&this->pimpl->m_pos,(ulong)(uVar3 + 8 + (uVar3 & 1)));
  ~Chunk((Chunk *)&stack0xffffffffffffff80);
  return this;
}

Assistant:

iter &iter::operator++() {
  auto im = new riffcpp::Chunk::impl();
  im->m_stream = pimpl->m_stream;
  im->m_pos = pimpl->m_pos;

  im->m_id = read_id(im->m_stream, im->m_pos);
  im->m_size = read_size(im->m_stream, im->m_pos);

  auto limit = im->m_pos + std::streamoff{im->m_size};

  if (limit > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
  im->m_limit = limit;

  riffcpp::Chunk chunk{im};
  std::uint32_t sz = chunk.size();
  std::streamoff offs{sz + sz % 2 + 8};

  pimpl->m_pos += offs;
  return *this;
}